

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_msa_ld_h_mipsel(CPUMIPSState_conflict2 *env,uint32_t wd,target_ulong_conflict addr)

{
  uint idx;
  TCGMemOpIdx oi_00;
  fpr_t *pfVar1;
  tcg_target_ulong tVar2;
  uintptr_t unaff_retaddr;
  TCGMemOpIdx oi;
  wr_t *pwd;
  target_ulong_conflict addr_local;
  uint32_t wd_local;
  CPUMIPSState_conflict2 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  idx = cpu_mmu_index(env,false);
  oi_00 = make_memop_idx(MO_AMASK|MO_16,idx);
  tVar2 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr,oi_00,unaff_retaddr);
  *(short *)pfVar1 = (short)tVar2;
  tVar2 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 2,oi_00,unaff_retaddr);
  *(short *)((long)pfVar1 + 2) = (short)tVar2;
  tVar2 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 4,oi_00,unaff_retaddr);
  *(short *)((long)pfVar1 + 4) = (short)tVar2;
  tVar2 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 6,oi_00,unaff_retaddr);
  *(short *)((long)pfVar1 + 6) = (short)tVar2;
  tVar2 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 8,oi_00,unaff_retaddr);
  *(short *)((long)pfVar1 + 8) = (short)tVar2;
  tVar2 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 10,oi_00,unaff_retaddr);
  *(short *)((long)pfVar1 + 10) = (short)tVar2;
  tVar2 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 0xc,oi_00,unaff_retaddr);
  *(short *)((long)pfVar1 + 0xc) = (short)tVar2;
  tVar2 = helper_le_lduw_mmu_mipsel((CPUArchState_conflict8 *)env,addr + 0xe,oi_00,unaff_retaddr);
  *(short *)((long)pfVar1 + 0xe) = (short)tVar2;
  return;
}

Assistant:

void helper_msa_ld_h(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    MEMOP_IDX(DF_HALF)
#if !defined(HOST_WORDS_BIGENDIAN)
    pwd->h[0] = helper_ret_lduw_mmu(env, addr + (0 << DF_HALF), oi, GETPC());
    pwd->h[1] = helper_ret_lduw_mmu(env, addr + (1 << DF_HALF), oi, GETPC());
    pwd->h[2] = helper_ret_lduw_mmu(env, addr + (2 << DF_HALF), oi, GETPC());
    pwd->h[3] = helper_ret_lduw_mmu(env, addr + (3 << DF_HALF), oi, GETPC());
    pwd->h[4] = helper_ret_lduw_mmu(env, addr + (4 << DF_HALF), oi, GETPC());
    pwd->h[5] = helper_ret_lduw_mmu(env, addr + (5 << DF_HALF), oi, GETPC());
    pwd->h[6] = helper_ret_lduw_mmu(env, addr + (6 << DF_HALF), oi, GETPC());
    pwd->h[7] = helper_ret_lduw_mmu(env, addr + (7 << DF_HALF), oi, GETPC());
#else
    pwd->h[0] = helper_ret_lduw_mmu(env, addr + (3 << DF_HALF), oi, GETPC());
    pwd->h[1] = helper_ret_lduw_mmu(env, addr + (2 << DF_HALF), oi, GETPC());
    pwd->h[2] = helper_ret_lduw_mmu(env, addr + (1 << DF_HALF), oi, GETPC());
    pwd->h[3] = helper_ret_lduw_mmu(env, addr + (0 << DF_HALF), oi, GETPC());
    pwd->h[4] = helper_ret_lduw_mmu(env, addr + (7 << DF_HALF), oi, GETPC());
    pwd->h[5] = helper_ret_lduw_mmu(env, addr + (6 << DF_HALF), oi, GETPC());
    pwd->h[6] = helper_ret_lduw_mmu(env, addr + (5 << DF_HALF), oi, GETPC());
    pwd->h[7] = helper_ret_lduw_mmu(env, addr + (4 << DF_HALF), oi, GETPC());
#endif
}